

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack8_8(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar7._8_8_ = 0x1000000008;
  auVar7._0_8_ = 0x1000000008;
  uVar1 = *in;
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar5 = vpbroadcastd_avx512vl();
  auVar7 = vpshufd_avx(auVar7,0x50);
  auVar3 = vpsrlvd_avx2(auVar6,auVar7);
  auVar4 = vpsrlvd_avx2(auVar5._0_16_,auVar7);
  auVar7 = vpblendd_avx2(auVar3,auVar6,1);
  auVar2 = vpblendd_avx2(ZEXT1632(auVar7),auVar5,0x10);
  auVar5._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar2._0_16_;
  auVar5._16_16_ = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar4;
  auVar5 = vpblendd_avx2(auVar2,auVar5,0x60);
  auVar5 = vpand_avx2(auVar5,_DAT_001a53e0);
  auVar2 = vpshufb_avx2(auVar2,_DAT_001a5400);
  auVar5 = vpblendd_avx2(auVar5,auVar2,0x88);
  *(undefined1 (*) [32])out = auVar5;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack8_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;

  return in;
}